

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsmp.cc
# Opt level: O2

void __thiscall bsplib::Bsmp::sync(Bsmp *this)

{
  A2A *this_00;
  ostringstream *poVar1;
  pointer ppVar2;
  void *__dest;
  void *__dest_00;
  exception *peVar3;
  exception *e;
  char in_SIL;
  size_t extra_bytes;
  int p;
  int iVar4;
  long lVar5;
  size_t tag_size;
  size_t *local_200;
  size_t counter;
  AlignedBuf *local_1f0;
  AlignedBuf *local_1e8;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_1e0;
  size_t size;
  exception local_1d0;
  
  ppVar2 = (this->m_payloads).
           super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_payloads).
      super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    (this->m_payloads).
    super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
  (this->m_tag_buffer).m_size = 0;
  (this->m_payload_buffer).m_size = 0;
  if (in_SIL == '\0') {
    local_1e0 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                 *)&this->m_payloads;
    local_1e8 = &this->m_tag_buffer;
    local_1f0 = &this->m_payload_buffer;
    this_00 = &this->m_a2a;
    local_200 = &this->m_next_tag_size;
    for (iVar4 = 0; iVar4 < (this->m_a2a).m_nprocs; iVar4 = iVar4 + 1) {
      serial<unsigned_int>(this_00,iVar4,0);
      serial<unsigned_long>(this_00,iVar4,this->m_set_tag_size_counter);
      serial<unsigned_long>(this_00,iVar4,this->m_next_tag_size);
    }
    A2A::exchange(this_00);
    this->m_total_n_messages = 0;
    this->m_total_payload = 0;
    for (lVar5 = 0; lVar5 < (this->m_a2a).m_nprocs; lVar5 = lVar5 + 1) {
      while( true ) {
        iVar4 = (int)lVar5;
        deserial<unsigned_long>(this_00,iVar4,&size);
        if (size == 0) break;
        extra_bytes = size - 1;
        __dest = AlignedBuf::append(local_1e8,this->m_send_tag_size);
        local_1d0._0_8_ = (this->m_payload_buffer).m_size;
        local_1d0._8_8_ = extra_bytes;
        std::
        vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
        ::emplace_back<std::pair<unsigned_long,unsigned_long>>
                  (local_1e0,(pair<unsigned_long,_unsigned_long> *)&local_1d0);
        __dest_00 = AlignedBuf::append(local_1f0,extra_bytes);
        memcpy(__dest,(this->m_a2a).m_recv_bufs.super__Vector_base<char,_std::allocator<char>_>.
                      _M_impl.super__Vector_impl_data._M_start +
                      (this->m_a2a).m_recv_pos.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar5] + (this->m_a2a).m_recv_cap * lVar5,
               this->m_send_tag_size);
        A2A::recv_pop(this_00,iVar4,this->m_send_tag_size);
        memcpy(__dest_00,
               (this->m_a2a).m_recv_bufs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start +
               (this->m_a2a).m_recv_pos.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5] + (this->m_a2a).m_recv_cap * lVar5,
               extra_bytes);
        A2A::recv_pop(this_00,iVar4,extra_bytes);
        this->m_total_n_messages = this->m_total_n_messages + 1;
        this->m_total_payload = extra_bytes + this->m_total_payload;
      }
      counter = 0xffffffffffffffff;
      deserial<unsigned_long>(this_00,iVar4,&counter);
      if (counter != this->m_set_tag_size_counter) {
        peVar3 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_1d0,"bsp_set_tagsize");
        std::operator<<((ostream *)&local_1d0.m_stream,
                        "Not all processes set the tag size same number of times\n");
        exception::exception(peVar3,&local_1d0);
        __cxa_throw(peVar3,&exception::typeinfo,exception::~exception);
      }
      tag_size = 0xffffffffffffffff;
      deserial<unsigned_long>(this_00,iVar4,&tag_size);
      if (tag_size != *local_200) {
        peVar3 = (exception *)__cxa_allocate_exception(0x1a0);
        exception::exception(&local_1d0,"bsp_set_tagsize");
        poVar1 = &local_1d0.m_stream;
        std::operator<<((ostream *)poVar1,"Not all processes announced the same tag size\n");
        std::operator<<((ostream *)poVar1,"  -> process ");
        std::ostream::operator<<((ostream *)poVar1,(this->m_a2a).m_pid);
        std::operator<<((ostream *)poVar1," got ");
        e = exception::operator<<(&local_1d0,local_200);
        poVar1 = &e->m_stream;
        std::operator<<((ostream *)poVar1,'\n');
        std::operator<<((ostream *)poVar1,"  -> process ");
        std::ostream::operator<<((ostream *)poVar1,iVar4);
        std::operator<<((ostream *)poVar1," got ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::operator<<((ostream *)poVar1,'\n');
        exception::exception(peVar3,e);
        __cxa_throw(peVar3,&exception::typeinfo,exception::~exception);
      }
    }
  }
  this->m_send_empty = true;
  this->m_recv_tag_size = this->m_send_tag_size;
  this->m_send_tag_size = this->m_next_tag_size;
  this->m_set_tag_size_counter = 0;
  return;
}

Assistant:

void Bsmp::sync( bool dummy ) 
{
    m_payloads.clear();
    m_tag_buffer.clear();
    m_payload_buffer.clear();

    if (!dummy) {
#ifdef PROFILE
    TicToc t( TicToc::BSMP);
#endif

    const unsigned marker = 0;
    for (int p = 0; p < m_a2a.nprocs(); ++p ) {
        serial( m_a2a, p, marker );
        serial( m_a2a, p, m_set_tag_size_counter );
        serial( m_a2a, p, m_next_tag_size );
    
#ifdef PROFILE
        t.add_bytes( m_a2a.send_size(p) );
#endif
    }

    m_a2a.exchange( );

    m_total_n_messages = 0; 
    m_total_payload = 0;
    for (int p = 0 ; p < m_a2a.nprocs(); ++p )
    {
        size_t size;
        while ( deserial( m_a2a, p, size ), size != marker ) {
            size_t payload_size = size - 1;

            void * tag = m_tag_buffer.append( m_send_tag_size );
            m_payloads.push_back(
                    std::make_pair( m_payload_buffer.size(), payload_size ) 
                    );
            void * payload = m_payload_buffer.append( payload_size );
          
            std::memcpy( tag, m_a2a.recv_top(p), m_send_tag_size );
            m_a2a.recv_pop(p, m_send_tag_size );
            std::memcpy( payload, m_a2a.recv_top(p), payload_size );
            m_a2a.recv_pop(p, payload_size );

            m_total_n_messages += 1;
            m_total_payload += payload_size;
        }

        size_t counter = size_t(-1);
        deserial( m_a2a, p, counter );
        if (counter != m_set_tag_size_counter )
            throw exception("bsp_set_tagsize") 
                << "Not all processes set the tag size same number of times\n";

        size_t tag_size = size_t(-1);
        deserial( m_a2a, p, tag_size );
        if (tag_size != m_next_tag_size)
            throw exception("bsp_set_tagsize") 
                << "Not all processes announced the same tag size\n"
                << "  -> process " << m_a2a.pid() 
                                   << " got " << m_next_tag_size << '\n'
                << "  -> process " << p << " got " << tag_size << '\n';
    } 
    } // if (!dummy)
    
    m_send_empty = true;

    // update tag size
    m_recv_tag_size = m_send_tag_size;
    m_send_tag_size = m_next_tag_size;
    m_set_tag_size_counter = 0;
}